

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O2

void __thiscall
FastPForLib::CompositeCodec<FastPForLib::SIMDPFor,_FastPForLib::VariableByte>::~CompositeCodec
          (CompositeCodec<FastPForLib::SIMDPFor,_FastPForLib::VariableByte> *this)

{
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001b8f10;
  SIMDPFor::~SIMDPFor(&this->codec1);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}